

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

Uint64 __thiscall Diligent::FenceVkImpl::GetCompletedValue(FenceVkImpl *this)

{
  bool bVar1;
  VulkanLogicalDevice *this_00;
  VkSemaphore_T *TimelineSemaphore;
  Char *Message;
  lock_guard<std::mutex> local_68;
  lock_guard<std::mutex> Lock;
  undefined1 local_50 [8];
  string msg;
  FenceVkImpl *pFStack_28;
  VkResult err;
  Uint64 SemaphoreCounter;
  VulkanLogicalDevice *LogicalDevice;
  FenceVkImpl *this_local;
  
  LogicalDevice = (VulkanLogicalDevice *)this;
  bVar1 = IsTimelineSemaphore(this);
  if (bVar1) {
    this_00 = RenderDeviceVkImpl::GetLogicalDevice
                        ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                         .m_pDevice);
    pFStack_28 = (FenceVkImpl *)0xffffffffffffffff;
    SemaphoreCounter = (Uint64)this_00;
    TimelineSemaphore =
         VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkSemaphore_T_
                   ((VulkanObjectWrapper *)&this->m_TimelineSemaphore);
    msg.field_2._12_4_ =
         VulkanUtilities::VulkanLogicalDevice::GetSemaphoreCounter
                   (this_00,TimelineSemaphore,(uint64_t *)&stack0xffffffffffffffd8);
    if (msg.field_2._12_4_ != VK_SUCCESS) {
      FormatString<char[41]>
                ((string *)local_50,(char (*) [41])"Failed to get timeline semaphore counter");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetCompletedValue",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0x75);
      std::__cxx11::string::~string((string *)local_50);
    }
    this_local = pFStack_28;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&local_68,&this->m_SyncPointsGuard);
    this_local = (FenceVkImpl *)InternalGetCompletedValue(this);
    std::lock_guard<std::mutex>::~lock_guard(&local_68);
  }
  return (Uint64)this_local;
}

Assistant:

Uint64 FenceVkImpl::GetCompletedValue()
{
    if (IsTimelineSemaphore())
    {
        // GetSemaphoreCounter() is thread safe

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        Uint64   SemaphoreCounter = ~Uint64{0};
        VkResult err              = LogicalDevice.GetSemaphoreCounter(m_TimelineSemaphore, &SemaphoreCounter);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to get timeline semaphore counter");
        return SemaphoreCounter;
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};
        return InternalGetCompletedValue();
    }
}